

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

bool __thiscall QCompleter::eventFilter(QCompleter *this,QObject *o,QEvent *e)

{
  ushort uVar1;
  QCompleterPrivate *this_00;
  Data *pDVar2;
  QAbstractItemView *this_01;
  QModelIndex index;
  QModelIndex index_00;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  QObject *pQVar9;
  long lVar10;
  QCompletionModel *pQVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar14;
  undefined8 local_88;
  undefined8 uStack_80;
  QAbstractItemModel *pQStack_78;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCompleterPrivate **)&this->field_0x8;
  pDVar2 = (this_00->widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar9 = (QObject *)0x0;
  }
  else {
    pQVar9 = (this_00->widget).wp.value;
  }
  if (pQVar9 == o) {
    if (*(short *)(e + 8) == 0x12) {
      if ((QWidget *)this_00->popup != (QWidget *)0x0) {
        QWidget::hide((QWidget *)this_00->popup);
      }
      goto LAB_0065af21;
    }
    if ((*(short *)(e + 8) != 9) || (this_00->eatFocusOut != true)) goto LAB_0065af21;
    this_00->hiddenBecauseNoMatch = false;
    if ((this_00->popup == (QAbstractItemView *)0x0) ||
       (bVar4 = true,
       (((this_00->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
        widget_attributes & 0x8000) == 0)) goto LAB_0065af21;
    goto LAB_0065b0fa;
  }
LAB_0065af21:
  this_01 = (QAbstractItemView *)this_00->popup;
  if (this_01 != (QAbstractItemView *)o) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar3 = QObject::eventFilter(&this->super_QObject,(QEvent *)o);
      return (bool)uVar3;
    }
    goto LAB_0065b52d;
  }
  uVar1 = *(ushort *)(e + 8);
  bVar4 = false;
  if (uVar1 < 6) {
    if (uVar1 == 2) {
      if ((*(byte *)(*(long *)(this_01 + 0x20) + 8) & 2) != 0) goto LAB_0065b0f8;
      cVar5 = QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
      bVar4 = true;
      if (cVar5 == '\0') {
        QWidget::hide((QWidget *)this_00->popup);
      }
    }
    else if (uVar1 == 3) {
      QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
      bVar4 = true;
    }
  }
  else if ((uVar1 == 0x53) || (uVar1 == 0x33)) {
    pDVar2 = (this_00->widget).wp.d;
    if ((pDVar2 != (Data *)0x0) &&
       ((*(int *)(pDVar2 + 4) != 0 && ((this_00->widget).wp.value != (QObject *)0x0)))) {
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar9 = (QObject *)0x0;
      }
      else {
        pQVar9 = (this_00->widget).wp.value;
      }
      QCoreApplication::sendEvent(pQVar9,e);
    }
LAB_0065b0f8:
    bVar4 = false;
  }
  else {
    bVar4 = false;
    if (uVar1 == 6) {
      local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::currentIndex((QModelIndex *)&local_48,this_01);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)this_00->popup);
      QItemSelectionModel::selectedIndexes();
      iVar7 = *(int *)(e + 0x40);
      uVar6 = iVar7 + 0xfefffff0;
      if (uVar6 < 8) {
        if ((3U >> (uVar6 & 0x1f) & 1) != 0) {
switchD_0065b147_caseD_0:
          uVar6 = QKeyEvent::modifiers();
          uVar6 = uVar6 >> 0x1a;
joined_r0x0065b058:
          if ((uVar6 & 1) == 0) goto switchD_0065b147_caseD_2;
LAB_0065b3ed:
          bVar4 = false;
          goto switchD_0065b147_caseD_6;
        }
        if ((0x28U >> (uVar6 & 0x1f) & 1) == 0) {
          uVar6 = 0xc0 >> (uVar6 & 0x1f);
          goto joined_r0x0065b058;
        }
        iVar8 = (int)local_48;
        if ((((local_58 != (undefined1 *)0x0) || ((int)local_48 < 0)) || ((long)local_48 < 0)) ||
           ((local_38.ptr == (QAbstractItemModel *)0x0 ||
            (this_00->mode != UnfilteredPopupCompletion)))) {
          bVar4 = false;
          switch(uVar6) {
          case 0:
          case 1:
            goto switchD_0065b147_caseD_0;
          default:
            goto switchD_0065b147_caseD_2;
          case 3:
            if ((((int)local_48 < 0) || ((long)local_48 < 0)) ||
               (local_38.ptr == (QAbstractItemModel *)0x0)) {
              local_88 = (undefined1 *)0xffffffffffffffff;
              uStack_80 = (undefined1 *)0x0;
              pQStack_78 = (QAbstractItemModel *)0x0;
              iVar8 = (**(code **)(*(long *)this_00->proxy + 0x78))(this_00->proxy,&local_88);
              pQVar11 = this_00->proxy;
              iVar8 = iVar8 + -1;
              iVar7 = this_00->column;
              lVar10 = *(long *)pQVar11;
LAB_0065b494:
              pQStack_78 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
              local_88 = &DAT_aaaaaaaaaaaaaaaa;
              (**(code **)(lVar10 + 0x60))(&local_88,pQVar11,iVar8,iVar7);
              iVar7 = (int)local_88;
              iVar8 = local_88._4_4_;
              uVar12 = (undefined4)uStack_80;
              uVar13 = uStack_80._4_4_;
              tVar14.ptr = pQStack_78;
              goto LAB_0065b4a4;
            }
            if ((int)local_48 != 0) goto LAB_0065b3ed;
            cVar5 = this_00->wrap;
joined_r0x0065b39a:
            bVar4 = true;
            if (cVar5 == '\x01') {
              bVar4 = true;
              QCompleterPrivate::setCurrentIndex
                        (this_00,(QModelIndex)ZEXT824(0xffffffffffffffff),true);
            }
            break;
          case 5:
            if ((((int)local_48 < 0) || ((long)local_48 < 0)) ||
               (local_38.ptr == (QAbstractItemModel *)0x0)) {
              pQVar11 = this_00->proxy;
              iVar7 = this_00->column;
              lVar10 = *(long *)pQVar11;
              iVar8 = 0;
              goto LAB_0065b494;
            }
            local_88 = (undefined1 *)0xffffffffffffffff;
            uStack_80 = (undefined1 *)0x0;
            pQStack_78 = (QAbstractItemModel *)0x0;
            iVar7 = (**(code **)(*(long *)this_00->proxy + 0x78))();
            if (iVar8 == iVar7 + -1) {
              cVar5 = this_00->wrap;
              goto joined_r0x0065b39a;
            }
            goto LAB_0065b3ed;
          case 6:
          case 7:
            break;
          }
          goto switchD_0065b147_caseD_6;
        }
        iVar7 = (int)local_48;
        iVar8 = local_48._4_4_;
        uVar12 = (undefined4)uStack_40;
        uVar13 = uStack_40._4_4_;
        tVar14.ptr = local_38.ptr;
LAB_0065b4a4:
        index_00.c = iVar8;
        index_00.r = iVar7;
        index_00.i._0_4_ = uVar12;
        index_00.i._4_4_ = uVar13;
        index_00.m.ptr = tVar14.ptr;
        QCompleterPrivate::setCurrentIndex(this_00,index_00,true);
LAB_0065b4b5:
        bVar4 = true;
      }
      else {
switchD_0065b147_caseD_2:
        pDVar2 = (this_00->widget).wp.d;
        if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
           ((this_00->widget).wp.value != (QObject *)0x0)) {
          this_00->eatFocusOut = false;
          pQVar9 = (this_00->widget).wp.value;
          (**(code **)(*(long *)pQVar9 + 0x28))(pQVar9,e);
          this_00->eatFocusOut = true;
        }
        pDVar2 = (this_00->widget).wp.d;
        if (pDVar2 == (Data *)0x0) {
LAB_0065b1fe:
          bVar4 = true;
          if (e[0xc] != (QEvent)0x0) goto switchD_0065b147_caseD_6;
        }
        else if (((*(int *)(pDVar2 + 4) == 0) || ((this_00->widget).wp.value == (QObject *)0x0)) ||
                ((e[0xc] != (QEvent)0x0 ||
                 ((((this_00->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                   widget_attributes & 0x8000) == 0)))) {
          if ((((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
              ((this_00->widget).wp.value != (QObject *)0x0)) &&
             (bVar4 = QWidget::hasFocus((QWidget *)(this_00->widget).wp.value), !bVar4)) {
            QWidget::hide((QWidget *)this_00->popup);
          }
          goto LAB_0065b1fe;
        }
        cVar5 = QKeyEvent::matches((StandardKey)e);
        if (cVar5 != '\0') {
          QWidget::hide((QWidget *)this_00->popup);
          goto LAB_0065b4b5;
        }
        bVar4 = true;
        if (iVar7 < 0x1000004) {
          if (iVar7 == 0x1000001) goto LAB_0065b2df;
          if (iVar7 == 0x1000002) goto LAB_0065b2ce;
        }
        else if (iVar7 + 0xfefffffcU < 2) {
LAB_0065b2df:
          QWidget::hide((QWidget *)this_00->popup);
          if (((-1 < (int)local_48) && (-1 < (long)local_48)) &&
             (local_38.ptr != (QAbstractItemModel *)0x0)) {
            index.i._0_4_ = (int)uStack_40;
            index._0_8_ = local_48;
            index.i._4_4_ = (int)((ulong)uStack_40 >> 0x20);
            index.m.ptr = local_38.ptr;
            QCompleterPrivate::_q_complete(this_00,index,false);
          }
        }
        else if ((iVar7 == 0x1000033) && (uVar6 = QKeyEvent::modifiers(), (uVar6 >> 0x1b & 1) != 0))
        {
LAB_0065b2ce:
          QWidget::hide((QWidget *)this_00->popup);
        }
      }
switchD_0065b147_caseD_6:
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,0x18,0x10);
        }
      }
    }
  }
LAB_0065b0fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
LAB_0065b52d:
  __stack_chk_fail();
}

Assistant:

bool QCompleter::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QCompleter);

    if (o == d->widget) {
        switch (e->type()) {
        case QEvent::FocusOut:
            if (d->eatFocusOut) {
                d->hiddenBecauseNoMatch = false;
                if (d->popup && d->popup->isVisible())
                    return true;
            }
            break;
        case QEvent::Hide:
            if (d->popup)
                d->popup->hide();
            break;
        default:
            break;
        }
    }

    if (o != d->popup)
        return QObject::eventFilter(o, e);

    Q_ASSERT(d->popup);
    switch (e->type()) {
    case QEvent::KeyPress: {
        QKeyEvent *ke = static_cast<QKeyEvent *>(e);

        QModelIndex curIndex = d->popup->currentIndex();
        QModelIndexList selList = d->popup->selectionModel()->selectedIndexes();

        const int key = ke->key();
        // In UnFilteredPopup mode, select the current item
        if ((key == Qt::Key_Up || key == Qt::Key_Down) && selList.isEmpty() && curIndex.isValid()
            && d->mode == QCompleter::UnfilteredPopupCompletion) {
              d->setCurrentIndex(curIndex);
              return true;
        }

        // Handle popup navigation keys. These are hardcoded because up/down might make the
        // widget do something else (lineedit cursor moves to home/end on mac, for instance)
        switch (key) {
        case Qt::Key_End:
        case Qt::Key_Home:
            if (ke->modifiers() & Qt::ControlModifier)
                return false;
            break;

        case Qt::Key_Up:
            if (!curIndex.isValid()) {
                int rowCount = d->proxy->rowCount();
                QModelIndex lastIndex = d->proxy->index(rowCount - 1, d->column);
                d->setCurrentIndex(lastIndex);
                return true;
            } else if (curIndex.row() == 0) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_Down:
            if (!curIndex.isValid()) {
                QModelIndex firstIndex = d->proxy->index(0, d->column);
                d->setCurrentIndex(firstIndex);
                return true;
            } else if (curIndex.row() == d->proxy->rowCount() - 1) {
                if (d->wrap)
                    d->setCurrentIndex(QModelIndex());
                return true;
            }
            return false;

        case Qt::Key_PageUp:
        case Qt::Key_PageDown:
            return false;
        }

        if (d->widget) {
            // Send the event to the widget. If the widget accepted the event, do nothing
            // If the widget did not accept the event, provide a default implementation
            d->eatFocusOut = false;
            (static_cast<QObject *>(d->widget))->event(ke);
            d->eatFocusOut = true;
        }
        if (!d->widget || e->isAccepted() || !d->popup->isVisible()) {
            // widget lost focus, hide the popup
            if (d->widget && (!d->widget->hasFocus()
#ifdef QT_KEYPAD_NAVIGATION
                || (QApplicationPrivate::keypadNavigationEnabled() && !d->widget->hasEditFocus())
#endif
                ))
                d->popup->hide();
            if (e->isAccepted())
                return true;
        }

        // default implementation for keys not handled by the widget when popup is open
#if QT_CONFIG(shortcut)
        if (ke->matches(QKeySequence::Cancel)) {
            d->popup->hide();
            return true;
        }
#endif
        switch (key) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (!QApplicationPrivate::keypadNavigationEnabled())
                break;
#endif
        case Qt::Key_Return:
        case Qt::Key_Enter:
        case Qt::Key_Tab:
            d->popup->hide();
            if (curIndex.isValid())
                d->_q_complete(curIndex);
            break;

        case Qt::Key_F4:
            if (ke->modifiers() & Qt::AltModifier)
                d->popup->hide();
            break;

        case Qt::Key_Backtab:
            d->popup->hide();
            break;

        default:
            break;
        }

        return true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::KeyRelease: {
        if (d->widget &&
            QApplicationPrivate::keypadNavigationEnabled() && ke->key() == Qt::Key_Back) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            // Send the event to the 'widget'. This is what we did for KeyPress, so we need
            // to do the same for KeyRelease, in case the widget's KeyPress event set
            // up something (such as a timer) that is relying on also receiving the
            // key release. I see this as a bug in Qt, and should really set it up for all
            // the affected keys. However, it is difficult to tell how this will affect
            // existing code, and I can't test for every combination!
            d->eatFocusOut = false;
            static_cast<QObject *>(d->widget)->event(ke);
            d->eatFocusOut = true;
        }
        break;
    }
#endif

    case QEvent::MouseButtonPress: {
#ifdef QT_KEYPAD_NAVIGATION
        if (d->widget
            && QApplicationPrivate::keypadNavigationEnabled()) {
            // if we've clicked in the widget (or its descendant), let it handle the click
            QWidget *source = qobject_cast<QWidget *>(o);
            if (source) {
                QPoint pos = source->mapToGlobal((static_cast<QMouseEvent *>(e))->pos());
                QWidget *target = QApplication::widgetAt(pos);
                if (target && (d->widget->isAncestorOf(target) ||
                    target == d->widget)) {
                    d->eatFocusOut = false;
                    static_cast<QObject *>(target)->event(e);
                    d->eatFocusOut = true;
                    return true;
                }
            }
        }
#endif
        if (!d->popup->underMouse()) {
            if (!QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e))
                d->popup->hide();
            return true;
        }
        }
        return false;

    case QEvent::MouseButtonRelease:
        QGuiApplicationPrivate::maybeForwardEventToVirtualKeyboard(e);
        return true;
    case QEvent::InputMethod:
    case QEvent::ShortcutOverride:
        if (d->widget)
            QCoreApplication::sendEvent(d->widget, e);
        break;

    default:
        return false;
    }
    return false;
}